

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int writeJournalHdr(Pager *pPager)

{
  char *pcVar1;
  PagerSavepoint *pPVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  pcVar1 = pPager->pTmpSpace;
  uVar4 = pPager->sectorSize;
  uVar3 = pPager->pageSize;
  if (uVar4 <= (uint)pPager->pageSize) {
    uVar3 = uVar4;
  }
  iVar5 = pPager->nSavepoint;
  if (0 < (long)iVar5) {
    pPVar2 = pPager->aSavepoint;
    lVar6 = 0;
    do {
      if (*(long *)((long)pPVar2->aWalData + lVar6 + -0x18) == 0) {
        *(i64 *)((long)pPVar2->aWalData + lVar6 + -0x18) = pPager->journalOff;
      }
      lVar6 = lVar6 + 0x30;
    } while ((long)iVar5 * 0x30 != lVar6);
  }
  if (pPager->journalOff == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = ((pPager->journalOff + -1) / (long)(ulong)uVar4 + 1) * (ulong)uVar4;
  }
  pPager->journalOff = lVar6;
  pPager->journalHdr = lVar6;
  if (((pPager->noSync == '\0') && (pPager->journalMode != '\x04')) &&
     (uVar4 = (*pPager->fd->pMethods->xDeviceCharacteristics)(pPager->fd), (uVar4 >> 9 & 1) == 0)) {
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
  }
  else {
    pcVar1[0] = -0x27;
    pcVar1[1] = -0x2b;
    pcVar1[2] = '\x05';
    pcVar1[3] = -7;
    pcVar1[4] = ' ';
    pcVar1[5] = -0x5f;
    pcVar1[6] = 'c';
    pcVar1[7] = -0x29;
    pcVar1[8] = -1;
    pcVar1[9] = -1;
    pcVar1[10] = -1;
    pcVar1[0xb] = -1;
  }
  sqlite3_randomness(4,&pPager->cksumInit);
  uVar4 = pPager->cksumInit;
  *(uint *)(pcVar1 + 0xc) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar4 = pPager->dbOrigSize;
  *(uint *)(pcVar1 + 0x10) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar4 = pPager->sectorSize;
  *(uint *)(pcVar1 + 0x14) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar4 = pPager->pageSize;
  *(uint *)(pcVar1 + 0x18) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  memset(pcVar1 + 0x1c,0,(ulong)uVar3 - 0x1c);
  uVar4 = -uVar3;
  do {
    uVar4 = uVar4 + uVar3;
    if (pPager->sectorSize <= uVar4) {
      return 0;
    }
    iVar5 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,pcVar1,uVar3,pPager->journalOff);
    pPager->journalOff = pPager->journalOff + (ulong)uVar3;
  } while (iVar5 == 0);
  return iVar5;
}

Assistant:

static int writeJournalHdr(Pager *pPager){
  int rc = SQLITE_OK;                 /* Return code */
  char *zHeader = pPager->pTmpSpace;  /* Temporary space used to build header */
  u32 nHeader = (u32)pPager->pageSize;/* Size of buffer pointed to by zHeader */
  u32 nWrite;                         /* Bytes of header sector written */
  int ii;                             /* Loop counter */

  assert( isOpen(pPager->jfd) );      /* Journal file must be open. */

  if( nHeader>JOURNAL_HDR_SZ(pPager) ){
    nHeader = JOURNAL_HDR_SZ(pPager);
  }

  /* If there are active savepoints and any of them were created 
  ** since the most recent journal header was written, update the 
  ** PagerSavepoint.iHdrOffset fields now.
  */
  for(ii=0; ii<pPager->nSavepoint; ii++){
    if( pPager->aSavepoint[ii].iHdrOffset==0 ){
      pPager->aSavepoint[ii].iHdrOffset = pPager->journalOff;
    }
  }

  pPager->journalHdr = pPager->journalOff = journalHdrOffset(pPager);

  /* 
  ** Write the nRec Field - the number of page records that follow this
  ** journal header. Normally, zero is written to this value at this time.
  ** After the records are added to the journal (and the journal synced, 
  ** if in full-sync mode), the zero is overwritten with the true number
  ** of records (see syncJournal()).
  **
  ** A faster alternative is to write 0xFFFFFFFF to the nRec field. When
  ** reading the journal this value tells SQLite to assume that the
  ** rest of the journal file contains valid page records. This assumption
  ** is dangerous, as if a failure occurred whilst writing to the journal
  ** file it may contain some garbage data. There are two scenarios
  ** where this risk can be ignored:
  **
  **   * When the pager is in no-sync mode. Corruption can follow a
  **     power failure in this case anyway.
  **
  **   * When the SQLITE_IOCAP_SAFE_APPEND flag is set. This guarantees
  **     that garbage data is never appended to the journal file.
  */
  assert( isOpen(pPager->fd) || pPager->noSync );
  if( pPager->noSync || (pPager->journalMode==PAGER_JOURNALMODE_MEMORY)
   || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_SAFE_APPEND) 
  ){
    memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
    put32bits(&zHeader[sizeof(aJournalMagic)], 0xffffffff);
  }else{
    memset(zHeader, 0, sizeof(aJournalMagic)+4);
  }

  /* The random check-hash initializer */ 
  sqlite3_randomness(sizeof(pPager->cksumInit), &pPager->cksumInit);
  put32bits(&zHeader[sizeof(aJournalMagic)+4], pPager->cksumInit);
  /* The initial database size */
  put32bits(&zHeader[sizeof(aJournalMagic)+8], pPager->dbOrigSize);
  /* The assumed sector size for this process */
  put32bits(&zHeader[sizeof(aJournalMagic)+12], pPager->sectorSize);

  /* The page size */
  put32bits(&zHeader[sizeof(aJournalMagic)+16], pPager->pageSize);

  /* Initializing the tail of the buffer is not necessary.  Everything
  ** works find if the following memset() is omitted.  But initializing
  ** the memory prevents valgrind from complaining, so we are willing to
  ** take the performance hit.
  */
  memset(&zHeader[sizeof(aJournalMagic)+20], 0,
         nHeader-(sizeof(aJournalMagic)+20));

  /* In theory, it is only necessary to write the 28 bytes that the 
  ** journal header consumes to the journal file here. Then increment the 
  ** Pager.journalOff variable by JOURNAL_HDR_SZ so that the next 
  ** record is written to the following sector (leaving a gap in the file
  ** that will be implicitly filled in by the OS).
  **
  ** However it has been discovered that on some systems this pattern can 
  ** be significantly slower than contiguously writing data to the file,
  ** even if that means explicitly writing data to the block of 
  ** (JOURNAL_HDR_SZ - 28) bytes that will not be used. So that is what
  ** is done. 
  **
  ** The loop is required here in case the sector-size is larger than the 
  ** database page size. Since the zHeader buffer is only Pager.pageSize
  ** bytes in size, more than one call to sqlite3OsWrite() may be required
  ** to populate the entire journal header sector.
  */ 
  for(nWrite=0; rc==SQLITE_OK&&nWrite<JOURNAL_HDR_SZ(pPager); nWrite+=nHeader){
    IOTRACE(("JHDR %p %lld %d\n", pPager, pPager->journalHdr, nHeader))
    rc = sqlite3OsWrite(pPager->jfd, zHeader, nHeader, pPager->journalOff);
    assert( pPager->journalHdr <= pPager->journalOff );
    pPager->journalOff += nHeader;
  }

  return rc;
}